

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O1

void __thiscall
duckdb::Deserializer::
ReadPropertyWithExplicitDefault<duckdb::shared_ptr<duckdb::ParquetEncryptionConfig,true>>
          (Deserializer *this,field_id_t field_id,char *tag,
          shared_ptr<duckdb::ParquetEncryptionConfig,_true> *ret,
          shared_ptr<duckdb::ParquetEncryptionConfig,_true> *default_value)

{
  element_type *peVar1;
  char cVar2;
  char cVar3;
  undefined6 in_register_00000032;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ParquetEncryptionConfig *__tmp;
  _Alloc_hider _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  _Alloc_hider local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  
  cVar2 = (**(code **)(*(long *)this + 0x20))(this,CONCAT62(in_register_00000032,field_id));
  if (cVar2 == '\0') {
    peVar1 = (default_value->internal).
             super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var5 = (default_value->internal).
             super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (default_value->internal).
    super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (default_value->internal).
    super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (ret->internal).
              super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (ret->internal).super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar1;
    (ret->internal).super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var5;
    if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      cVar2 = '\0';
      goto LAB_00297b13;
    }
  }
  else {
    cVar3 = (**(code **)(*(long *)this + 0x50))(this);
    if (cVar3 == '\0') {
      _Var4._M_p = (pointer)0x0;
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      (**(code **)(*(long *)this + 0x30))(this);
      ParquetEncryptionConfig::Deserialize((ParquetEncryptionConfig *)&stack0xffffffffffffffc8,this)
      ;
      p_Var5 = p_Stack_30;
      _Var4._M_p = local_38._M_p;
      p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_38._M_p = (pointer)0x0;
      (**(code **)(*(long *)this + 0x38))(this);
    }
    (**(code **)(*(long *)this + 0x58))(this);
    (ret->internal).super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)_Var4._M_p;
    this_00 = (ret->internal).
              super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (ret->internal).super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var5;
    if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      cVar2 = '\x01';
      goto LAB_00297b13;
    }
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
LAB_00297b13:
  (**(code **)(*(long *)this + 0x28))(this,cVar2);
  return;
}

Assistant:

inline void ReadPropertyWithExplicitDefault(const field_id_t field_id, const char *tag, T &ret, T default_value) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			ret = std::forward<T>(default_value);
			OnOptionalPropertyEnd(false);
			return;
		}
		ret = Read<T>();
		OnOptionalPropertyEnd(true);
	}